

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

string * kwssys::SystemTools::Capitalized(string *s)

{
  int iVar1;
  ulong uVar2;
  char *pcVar3;
  undefined1 *puVar4;
  ulong in_RSI;
  string *in_RDI;
  size_t i;
  string *n;
  ulong local_30;
  
  std::__cxx11::string::string((string *)in_RDI);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    std::__cxx11::string::size();
    std::__cxx11::string::resize((ulong)in_RDI);
    pcVar3 = (char *)std::__cxx11::string::operator[](in_RSI);
    iVar1 = toupper((int)*pcVar3);
    puVar4 = (undefined1 *)std::__cxx11::string::operator[]((ulong)in_RDI);
    *puVar4 = (char)iVar1;
    for (local_30 = 1; uVar2 = std::__cxx11::string::size(), local_30 < uVar2;
        local_30 = local_30 + 1) {
      pcVar3 = (char *)std::__cxx11::string::operator[](in_RSI);
      iVar1 = tolower((int)*pcVar3);
      puVar4 = (undefined1 *)std::__cxx11::string::operator[]((ulong)in_RDI);
      *puVar4 = (char)iVar1;
    }
  }
  return in_RDI;
}

Assistant:

std::string SystemTools::Capitalized(const std::string& s)
{
  std::string n;
  if (s.empty()) {
    return n;
  }
  n.resize(s.size());
  n[0] = static_cast<std::string::value_type>(toupper(s[0]));
  for (size_t i = 1; i < s.size(); i++) {
    n[i] = static_cast<std::string::value_type>(tolower(s[i]));
  }
  return n;
}